

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O1

int run_test_udp_ipv6_only(void)

{
  int iVar1;
  int extraout_EAX;
  uv_udp_send_t *in_RCX;
  undefined8 *extraout_RDX;
  int iVar2;
  long lVar3;
  long lVar4;
  uv_udp_send_t *puVar5;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_udp_ipv6_only_cold_3();
    return 1;
  }
  lVar3 = 1;
  do_test(ipv6_recv_fail,1);
  if (recv_cb_called == 0) {
    if (send_cb_called == 1) {
      return 0;
    }
  }
  else {
    run_test_udp_ipv6_only_cold_1();
  }
  run_test_udp_ipv6_only_cold_2();
  lVar4 = lVar3;
  printf("got %d %.*s\n");
  iVar2 = (int)lVar4;
  puVar5 = in_RCX;
  iVar1 = is_from_client((sockaddr *)in_RCX);
  if ((iVar1 == 0) || ((lVar3 == 0 && (in_RCX == (uv_udp_send_t *)0x0)))) {
    return iVar1;
  }
  ipv6_recv_fail_cold_1();
  if (((puVar5 == (uv_udp_send_t *)&timeout) || (puVar5 == (uv_udp_send_t *)&server)) ||
     (puVar5 == (uv_udp_send_t *)&client)) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x54ed10;
  }
  alloc_cb_cold_1();
  if (puVar5 == &req_) {
    if (((req_.handle == (uv_udp_t *)&timeout) || (req_.handle == &server)) ||
       (req_.handle == &client)) {
      if (iVar2 == 0) {
        send_cb_called = send_cb_called + 1;
        return extraout_EAX;
      }
      goto LAB_00187db3;
    }
    send_cb_cold_2();
  }
  send_cb_cold_1();
LAB_00187db3:
  send_cb_cold_3();
  uv_close(&server,close_cb);
  uv_close(&client,close_cb);
  iVar1 = uv_close(&timeout,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_ipv6_only) {
  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  do_test(ipv6_recv_fail, UV_UDP_IPV6ONLY);

  ASSERT(recv_cb_called == 0);
  ASSERT(send_cb_called == 1);

  return 0;
}